

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void __thiscall cmCacheManager::CacheEntry::SetProperty(CacheEntry *this,string *prop,char *value)

{
  char *pcVar1;
  int iVar2;
  CacheEntryType CVar3;
  char *pcVar4;
  
  iVar2 = std::__cxx11::string::compare((char *)prop);
  if (iVar2 == 0) {
    pcVar4 = "STRING";
    if (value != (char *)0x0) {
      pcVar4 = value;
    }
    CVar3 = cmState::StringToCacheEntryType(pcVar4);
    this->Type = CVar3;
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)prop);
  if (iVar2 != 0) {
    cmPropertyMap::SetProperty(&this->Properties,prop,value);
    return;
  }
  pcVar4 = "";
  if (value != (char *)0x0) {
    pcVar4 = value;
  }
  pcVar1 = (char *)(this->Value)._M_string_length;
  strlen(pcVar4);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)pcVar4);
  return;
}

Assistant:

void cmCacheManager::CacheEntry::SetProperty(const std::string& prop,
                                             const char* value)
{
  if (prop == "TYPE") {
    this->Type = cmState::StringToCacheEntryType(value ? value : "STRING");
  } else if (prop == "VALUE") {
    this->Value = value ? value : "";
  } else {
    this->Properties.SetProperty(prop, value);
  }
}